

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Dot<3>::doExpand(Dot<3> *this,ExpandContext *param_1,ArgExprs *args)

{
  deInt32 *pdVar1;
  string *psVar2;
  undefined1 *puVar3;
  int *piVar4;
  Variable<tcu::Vector<float,_3>_> *pVVar5;
  long in_RCX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *extraout_RDX_06;
  SharedPtrStateBase *extraout_RDX_07;
  SharedPtrStateBase *extraout_RDX_08;
  int iVar7;
  ExprP<float> EVar8;
  ExprP<float> local_78;
  ExprP<float> local_68;
  ExprP<float> local_58;
  ExprP<float> local_48;
  long local_38;
  SharedPtrStateBase *pSVar6;
  
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_78,(int)in_RCX);
  local_38 = in_RCX + 0x10;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_68,(int)local_38);
  shaderexecutor::operator*((shaderexecutor *)this,&local_78,&local_68);
  if (local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if ((Variable<tcu::Vector<float,_3>_> *)
      local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state != (Variable<tcu::Vector<float,_3>_> *)0x0) {
    LOCK();
    psVar2 = (string *)
             &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
    *(int *)&(psVar2->_M_dataplus)._M_p = *(int *)&(psVar2->_M_dataplus)._M_p + -1;
    UNLOCK();
    if (*(int *)&(psVar2->_M_dataplus)._M_p == 0) {
      local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
           = (Expr<float> *)0x0;
      (*(((Expr<tcu::Vector<float,_3>_> *)
         &(local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase)->super_ExprBase)._vptr_ExprBase[2])();
    }
    LOCK();
    puVar3 = (undefined1 *)
             ((long)&(((string *)
                      &(local_78.super_ExprPBase<float>.
                        super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
                       strongRefCount)->_M_dataplus)._M_p + 4);
    *(int *)puVar3 = *(int *)puVar3 + -1;
    UNLOCK();
    if ((*(int *)puVar3 == 0) &&
       ((Variable<tcu::Vector<float,_3>_> *)
        local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state != (Variable<tcu::Vector<float,_3>_> *)0x0)) {
      (*(((Expr<tcu::Vector<float,_3>_> *)
         &(local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase)->super_ExprBase)._vptr_ExprBase[1])();
    }
  }
  iVar7 = 1;
  do {
    ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
              ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_48,(int)in_RCX);
    ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
              ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_58,(int)local_38);
    shaderexecutor::operator*((shaderexecutor *)&local_68,&local_48,&local_58);
    EVar8 = shaderexecutor::operator+((shaderexecutor *)&local_78,(ExprP<float> *)this,&local_68);
    pSVar6 = EVar8.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
             m_state;
    pVVar5 = (this->
             super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             ).m_var0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
             m_ptr;
    if (pVVar5 == (Variable<tcu::Vector<float,_3>_> *)
                  local_78.super_ExprPBase<float>.
                  super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state) {
LAB_00849eb0:
      if ((Variable<tcu::Vector<float,_3>_> *)
          local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (Variable<tcu::Vector<float,_3>_> *)0x0) {
        LOCK();
        psVar2 = (string *)
                 &(local_78.super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount
        ;
        *(int *)&(psVar2->_M_dataplus)._M_p = *(int *)&(psVar2->_M_dataplus)._M_p + -1;
        UNLOCK();
        if (*(int *)&(psVar2->_M_dataplus)._M_p == 0) {
          local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_ptr = (Expr<float> *)0x0;
          (*(((Expr<tcu::Vector<float,_3>_> *)
             &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
              _vptr_SharedPtrStateBase)->super_ExprBase)._vptr_ExprBase[2])();
          pSVar6 = extraout_RDX_01;
        }
        LOCK();
        puVar3 = (undefined1 *)
                 ((long)&(((string *)
                          &(local_78.super_ExprPBase<float>.
                            super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
                           strongRefCount)->_M_dataplus)._M_p + 4);
        *(int *)puVar3 = *(int *)puVar3 + -1;
        UNLOCK();
        if (*(int *)puVar3 == 0) {
          if ((Variable<tcu::Vector<float,_3>_> *)
              local_78.super_ExprPBase<float>.
              super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state !=
              (Variable<tcu::Vector<float,_3>_> *)0x0) {
            (*(((Expr<tcu::Vector<float,_3>_> *)
               &(local_78.super_ExprPBase<float>.
                 super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
                _vptr_SharedPtrStateBase)->super_ExprBase)._vptr_ExprBase[1])();
            pSVar6 = extraout_RDX_02;
          }
          local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      if (pVVar5 != (Variable<tcu::Vector<float,_3>_> *)0x0) {
        LOCK();
        psVar2 = &pVVar5->m_name;
        *(int *)&(psVar2->_M_dataplus)._M_p = *(int *)&(psVar2->_M_dataplus)._M_p + -1;
        UNLOCK();
        if (*(int *)&(psVar2->_M_dataplus)._M_p == 0) {
          (this->
          super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          ).
          super_Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          .super_FuncBase._vptr_FuncBase = (_func_int **)0x0;
          (*(((this->
              super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).m_var0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr)->super_Expr<tcu::Vector<float,_3>_>).super_ExprBase._vptr_ExprBase[2])();
          pSVar6 = extraout_RDX;
        }
        LOCK();
        piVar4 = (int *)((long)&(((this->
                                  super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                                  ).m_var0.
                                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                                 .m_ptr)->m_name)._M_dataplus._M_p + 4);
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if ((*piVar4 == 0) &&
           (pVVar5 = (this->
                     super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                     ).m_var0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                     m_ptr, pVVar5 != (Variable<tcu::Vector<float,_3>_> *)0x0)) {
          (*(pVVar5->super_Expr<tcu::Vector<float,_3>_>).super_ExprBase._vptr_ExprBase[1])();
          pSVar6 = extraout_RDX_00;
        }
      }
      (this->
      super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ).
      super_Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      .super_FuncBase._vptr_FuncBase =
           (_func_int **)
           local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
           m_ptr;
      (this->
      super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ).m_var0.super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr =
           (Variable<tcu::Vector<float,_3>_> *)
           local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
           m_state;
      if ((Variable<tcu::Vector<float,_3>_> *)
          local_78.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (Variable<tcu::Vector<float,_3>_> *)0x0) {
        LOCK();
        *(int *)&(((string *)
                  &(local_78.super_ExprPBase<float>.
                    super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
                   strongRefCount)->_M_dataplus)._M_p =
             *(int *)&(((string *)
                       &(local_78.super_ExprPBase<float>.
                         super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
                        strongRefCount)->_M_dataplus)._M_p + 1;
        UNLOCK();
        LOCK();
        piVar4 = (int *)((long)&(((this->
                                  super_DerivedFunc<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                                  ).m_var0.
                                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                                 .m_ptr)->m_name)._M_dataplus._M_p + 4);
        *piVar4 = *piVar4 + 1;
        UNLOCK();
        goto LAB_00849eb0;
      }
    }
    if (local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.super_ExprPBase<float>.
                 super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_ptr = (Expr<float> *)0x0;
        (*(local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[2])();
        pSVar6 = extraout_RDX_03;
      }
      LOCK();
      pdVar1 = &(local_68.super_ExprPBase<float>.
                 super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>
            .m_state != (SharedPtrStateBase *)0x0) {
          (*(local_68.super_ExprPBase<float>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
            _vptr_SharedPtrStateBase[1])();
          pSVar6 = extraout_RDX_04;
        }
        local_68.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_58.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_58.super_ExprPBase<float>.
                 super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_58.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_ptr = (Expr<float> *)0x0;
        (*(local_58.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[2])();
        pSVar6 = extraout_RDX_05;
      }
      LOCK();
      pdVar1 = &(local_58.super_ExprPBase<float>.
                 super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_58.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_58.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar6 = extraout_RDX_06;
      }
    }
    if (local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_48.super_ExprPBase<float>.
                 super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_ptr = (Expr<float> *)0x0;
        (*(local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[2])();
        pSVar6 = extraout_RDX_07;
      }
      LOCK();
      pdVar1 = &(local_48.super_ExprPBase<float>.
                 super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_48.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar6 = extraout_RDX_08;
      }
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 3) {
      EVar8.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state
           = pSVar6;
      EVar8.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
           (Expr<float> *)this;
      return (ExprP<float>)
             EVar8.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
    }
  } while( true );
}

Assistant:

ExprP<float>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		ExprP<float> val = args.a[0] * args.b[0];

		for (int ndx = 1; ndx < Size; ++ndx)
			val = val + args.a[ndx] * args.b[ndx];

		return val;
	}